

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_spot_values.cpp
# Opt level: O0

bool from_issue_145::
     test_uintwide_t_spot_values_from_issue_145<math::wide_integer::uintwide_t<128u,unsigned_int,void,false>>
               (uintwide_t<128U,_unsigned_int,_void,_false> *x)

{
  value_type_conflict *this;
  bool bVar1;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar2;
  byte local_63;
  byte local_62;
  byte local_61;
  uint local_60;
  undefined1 local_5c [8];
  local_unknown_integer_type a_2;
  local_unknown_integer_type a_1;
  undefined1 local_24 [8];
  local_unknown_integer_type a;
  bool local_result_is_ok;
  uintwide_t<128U,_unsigned_int,_void,_false> *x_local;
  
  a.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_ = 1;
  local_24 = *(undefined1 (*) [8])(x->values).super_array<unsigned_int,_4UL>.elems;
  a.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)((x->values).super_array<unsigned_int,_4UL>.elems + 2);
  unique0x10000307 = x;
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator+=
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_24,
             (uintwide_t<128U,_unsigned_int,_void,_false> *)local_24);
  a_1.values.super_array<unsigned_int,_4UL>.elems[2] = 2;
  join_0x00000010_0x00000000_ =
       (value_type_conflict  [4])
       math::wide_integer::operator*
                 (a_1.values.super_array<unsigned_int,_4UL>.elems + 2,stack0xfffffffffffffff0);
  bVar1 = math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator==
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_24,
                     (uintwide_t<128U,_unsigned_int,_void,_false> *)
                     (a_1.values.super_array<unsigned_int,_4UL>.elems + 3));
  local_61 = 0;
  if (bVar1) {
    local_61 = a.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_;
  }
  a.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_ = local_61 & 1;
  unique0x00012000 =
       *(undefined8 *)(stack0xfffffffffffffff0->values).super_array<unsigned_int,_4UL>.elems;
  a_1.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)((stack0xfffffffffffffff0->values).super_array<unsigned_int,_4UL>.elems + 2);
  this = a_2.values.super_array<unsigned_int,_4UL>.elems + 3;
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator-=
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)this,
             (uintwide_t<128U,_unsigned_int,_void,_false> *)this);
  a_2.values.super_array<unsigned_int,_4UL>.elems[2] = 0;
  eVar2 = math::wide_integer::operator==
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)
                     (a_2.values.super_array<unsigned_int,_4UL>.elems + 3),
                     a_2.values.super_array<unsigned_int,_4UL>.elems + 2);
  local_62 = 0;
  if (eVar2) {
    local_62 = a.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_;
  }
  a.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_ = local_62 & 1;
  local_5c = *(undefined1 (*) [8])
              (stack0xfffffffffffffff0->values).super_array<unsigned_int,_4UL>.elems;
  a_2.values.super_array<unsigned_int,_4UL>.elems._0_8_ =
       *(undefined8 *)((stack0xfffffffffffffff0->values).super_array<unsigned_int,_4UL>.elems + 2);
  math::wide_integer::uintwide_t<128U,_unsigned_int,_void,_false>::operator/=
            ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_5c,
             (uintwide_t<128U,_unsigned_int,_void,_false> *)local_5c);
  local_60 = 1;
  eVar2 = math::wide_integer::operator==
                    ((uintwide_t<128U,_unsigned_int,_void,_false> *)local_5c,&local_60);
  local_63 = 0;
  if (eVar2) {
    local_63 = a.values.super_array<unsigned_int,_4UL>.elems[2]._3_1_;
  }
  return (bool)(local_63 & 1);
}

Assistant:

auto test_uintwide_t_spot_values_from_issue_145(const UnknownIntegerType& x) -> bool
  {
    // See also https://github.com/ckormanyos/wide-integer/issues/145#issuecomment-1006374713

    using local_unknown_integer_type = UnknownIntegerType;

    bool local_result_is_ok = true;

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    {
      local_unknown_integer_type a = x; a += a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == (2U * x)) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a -= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 0U) && local_result_is_ok);
    }

    {
      local_unknown_integer_type a = x; a /= a; // NOLINT(clang-diagnostic-self-assign-overloaded)

      local_result_is_ok = ((a == 1U) && local_result_is_ok);
    }

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    return local_result_is_ok;
  }